

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PortSymbols.cpp
# Opt level: O2

bool slang::ast::anon_unknown_0::PortConnectionBuilder::areDimSizesEqual
               (span<const_slang::ConstantRange,_18446744073709551615UL> left,
               span<const_slang::ConstantRange,_18446744073709551615UL> right)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  size_t sVar6;
  bool bVar7;
  
  if (left._M_extent._M_extent_value._M_extent_value !=
      right._M_extent._M_extent_value._M_extent_value) {
    return false;
  }
  sVar6 = 0;
  do {
    bVar7 = left._M_extent._M_extent_value._M_extent_value == sVar6;
    if (bVar7) {
      return bVar7;
    }
    iVar1 = right._M_ptr[sVar6].left;
    iVar2 = right._M_ptr[sVar6].right;
    iVar3 = left._M_ptr[sVar6].left;
    iVar4 = left._M_ptr[sVar6].right;
    iVar5 = iVar1 - iVar2;
    if (iVar1 - iVar2 == 0 || iVar1 < iVar2) {
      iVar5 = -(iVar1 - iVar2);
    }
    iVar1 = iVar3 - iVar4;
    if (iVar3 - iVar4 == 0 || iVar3 < iVar4) {
      iVar1 = -(iVar3 - iVar4);
    }
    sVar6 = sVar6 + 1;
  } while (iVar1 == iVar5);
  return bVar7;
}

Assistant:

static bool areDimSizesEqual(std::span<const ConstantRange> left,
                                 std::span<const ConstantRange> right) {
        if (left.size() != right.size())
            return false;

        for (size_t i = 0; i < left.size(); i++) {
            if (left[i].width() != right[i].width())
                return false;
        }

        return true;
    }